

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void cfgfile::generator::generate_fields_in_ctor(ostream *stream,const_class_ptr_t c)

{
  pointer pfVar1;
  min_max_constraint_t *this;
  bool bVar2;
  int iVar3;
  vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
  *pvVar4;
  ostream *poVar5;
  string *psVar6;
  shared_ptr<cfgfile::generator::cfg::constraint_base_t> *psVar7;
  bool value;
  pointer this_00;
  allocator local_dc;
  allocator local_db;
  allocator local_da;
  allocator local_d9;
  ostream *local_d8;
  string local_d0 [32];
  string local_b0 [32];
  string local_90;
  string local_70 [32];
  string local_50 [32];
  
  local_d8 = stream;
  pvVar4 = cfg::class_t::fields(c);
  this_00 = (pvVar4->
            super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pfVar1 = (pvVar4->
           super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_00 == pfVar1) {
      return;
    }
    bVar2 = cfg::field_t::is_base(this_00);
    if (!bVar2) {
      std::__cxx11::string::string(local_70,"\t\t,\tm_",&local_da);
      poVar5 = std::operator<<(local_d8,local_70);
      psVar6 = cfg::field_t::name_abi_cxx11_(this_00);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      std::__cxx11::string::string(local_d0,"( *this, Trait::from_ascii( \"",&local_db);
      poVar5 = std::operator<<(poVar5,local_d0);
      psVar6 = cfg::field_t::name_abi_cxx11_(this_00);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      std::__cxx11::string::string(local_b0,"\" ), ",&local_dc);
      poVar5 = std::operator<<(poVar5,local_b0);
      bVar2 = cfg::field_t::is_required(this_00);
      bool_to_string_abi_cxx11_(&local_90,(generator *)(ulong)bVar2,value);
      poVar5 = std::operator<<(poVar5,(string *)&local_90);
      std::__cxx11::string::string(local_50," )\n",&local_d9);
      std::operator<<(poVar5,local_50);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_70);
      bVar2 = cfg::field_t::is_constraint_null(this_00);
      if (!bVar2) {
        psVar7 = cfg::field_t::constraint(this_00);
        this = (min_max_constraint_t *)
               (psVar7->
               super___shared_ptr<cfgfile::generator::cfg::constraint_base_t,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
        iVar3 = (*(this->super_constraint_base_t)._vptr_constraint_base_t[2])(this);
        if (iVar3 == 1) {
          std::__cxx11::string::string(local_70,"\t\t,\tm_",(allocator *)local_50);
          poVar5 = std::operator<<(local_d8,local_70);
          psVar6 = cfg::field_t::name_abi_cxx11_(this_00);
          poVar5 = std::operator<<(poVar5,(string *)psVar6);
          std::__cxx11::string::string(local_d0,"_constraint( ",&local_da);
          poVar5 = std::operator<<(poVar5,local_d0);
          psVar6 = cfg::min_max_constraint_t::min_abi_cxx11_(this);
          poVar5 = std::operator<<(poVar5,(string *)psVar6);
          std::__cxx11::string::string(local_b0,", ",&local_db);
          poVar5 = std::operator<<(poVar5,local_b0);
          psVar6 = cfg::min_max_constraint_t::max_abi_cxx11_(this);
          poVar5 = std::operator<<(poVar5,(string *)psVar6);
          std::__cxx11::string::string((string *)&local_90," )\n",&local_dc);
          std::operator<<(poVar5,(string *)&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string(local_b0);
        }
        else {
          if (iVar3 != 2) goto LAB_001157d8;
          std::__cxx11::string::string(local_70,"\t\t,\tm_",(allocator *)local_b0);
          poVar5 = std::operator<<(local_d8,local_70);
          psVar6 = cfg::field_t::name_abi_cxx11_(this_00);
          poVar5 = std::operator<<(poVar5,(string *)psVar6);
          std::__cxx11::string::string(local_d0,"_constraint()\n",(allocator *)&local_90);
          std::operator<<(poVar5,local_d0);
        }
        std::__cxx11::string::~string(local_d0);
        std::__cxx11::string::~string(local_70);
      }
    }
LAB_001157d8:
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

static inline void generate_fields_in_ctor( std::ostream & stream,
	cfg::const_class_ptr_t c )
{
	for( const cfg::field_t & f : c->fields() )
	{
		if( !f.is_base() )
		{
			stream << std::string( "\t\t,\tm_" )
				<< f.name() << std::string( "( *this, Trait::from_ascii( \"" )
				<< f.name() << std::string( "\" ), " )
				<< bool_to_string( f.is_required() )
				<< std::string( " )\n" );

			if( !f.is_constraint_null() )
			{
				cfg::constraint_base_t * constr = f.constraint().get();

				switch( constr->type() )
				{
					case cfg::constraint_base_t::min_max_constraint_type :
					{
						cfg::min_max_constraint_t * min_max =
							static_cast< cfg::min_max_constraint_t* > ( constr );

						stream << std::string( "\t\t,\tm_" )
							<< f.name() << std::string( "_constraint( " )
							<< min_max->min() << std::string( ", " )
							<< min_max->max() << std::string( " )\n" );
					}
						break;

					case cfg::constraint_base_t::one_of_constraint_type :
					{
						stream << std::string( "\t\t,\tm_" )
							<< f.name() << std::string( "_constraint()\n" );
					}
						break;

					default :
						break;
				}
			}
		}
	}
}